

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_RenderingVenue.cpp
# Opt level: O0

void __thiscall soul::TaskThread::waitForThreadToFinish(TaskThread *this)

{
  bool bVar1;
  __int_type _Var2;
  thread local_28;
  native_handle_type local_20;
  id local_18;
  TaskThread *local_10;
  TaskThread *this_local;
  
  local_10 = this;
  local_18 = std::this_thread::get_id();
  local_20 = (native_handle_type)std::thread::get_id(&this->thread);
  bVar1 = std::operator!=(local_18,(id)local_20);
  checkAssertion(bVar1,"std::this_thread::get_id() != thread.get_id()","waitForThreadToFinish",0x37)
  ;
  _Var2 = std::__atomic_base::operator_cast_to_int((__atomic_base *)&this->shuttingDown);
  checkAssertion(_Var2 != 0,"shuttingDown","waitForThreadToFinish",0x38);
  bVar1 = std::thread::joinable(&this->thread);
  if (bVar1) {
    std::thread::join();
    memset(&local_28,0,8);
    std::thread::thread(&local_28);
    std::thread::operator=(&this->thread,&local_28);
    std::thread::~thread(&local_28);
  }
  return;
}

Assistant:

void waitForThreadToFinish()
    {
        SOUL_ASSERT (std::this_thread::get_id() != thread.get_id());
        SOUL_ASSERT (shuttingDown);

        if (thread.joinable())
        {
            thread.join();
            thread = {};
        }
    }